

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  Btree *pBVar1;
  u8 uVar2;
  int iVar3;
  int nPathOut;
  u32 uVar4;
  sqlite3_io_methods *p_00;
  char *zPathOut;
  sqlite3_mutex *psVar5;
  char *__s2;
  sqlite3_vfs *psVar6;
  sqlite3_mutex *psVar7;
  void *pvVar8;
  sqlite3_file *id;
  bool bVar9;
  bool bVar10;
  int local_120;
  sqlite3_file *pFile;
  Btree *pSib;
  int i;
  sqlite3_mutex *mutexShared_1;
  Btree *pExisting;
  int iDb;
  sqlite3_mutex *mutexShared;
  char *zFullPathname;
  int nFullPathname;
  int nFilename;
  int isMemdb;
  int isTempDb;
  uchar zDbHeader [100];
  byte local_55;
  int local_54;
  u8 nReserve;
  sqlite3_mutex *psStack_50;
  int rc;
  sqlite3_mutex *mutexOpen;
  Btree *p;
  BtShared *pBt;
  int vfsFlags_local;
  int flags_local;
  Btree **ppBtree_local;
  sqlite3 *db_local;
  char *zFilename_local;
  sqlite3_vfs *pVfs_local;
  
  p = (Btree *)0x0;
  psStack_50 = (sqlite3_mutex *)0x0;
  local_54 = 0;
  bVar9 = true;
  if (zFilename == (char *)0x0) {
LAB_0013b5e3:
    if (bVar9) {
      iVar3 = sqlite3TempInMemory(db);
      bVar10 = true;
      if (iVar3 != 0) goto LAB_0013b618;
    }
    bVar10 = (vfsFlags & 0x80U) != 0;
  }
  else {
    bVar9 = *zFilename == '\0';
    iVar3 = strcmp(zFilename,":memory:");
    bVar10 = true;
    if (iVar3 != 0) goto LAB_0013b5e3;
  }
LAB_0013b618:
  pBt._4_4_ = flags;
  if (bVar10) {
    pBt._4_4_ = flags | 2;
  }
  pBt._0_4_ = vfsFlags;
  if (((vfsFlags & 0x100U) != 0) && ((bVar10 || (bVar9)))) {
    pBt._0_4_ = vfsFlags & 0xfffffeffU | 0x200;
  }
  p_00 = (sqlite3_io_methods *)sqlite3MallocZero(0x48);
  if (p_00 == (sqlite3_io_methods *)0x0) {
    return 7;
  }
  *(u8 *)&p_00->xRead = '\0';
  *(sqlite3 **)p_00 = db;
  ((BtLock *)&p_00->xFileSize)->pBtree = (Btree *)p_00;
  *(Pgno *)&p_00->xLock = 1;
  if ((!bVar9) && (((!bVar10 || (((uint)pBt & 0x40) != 0)) && (((uint)pBt & 0x20000) != 0)))) {
    iVar3 = sqlite3Strlen30(zFilename);
    iVar3 = iVar3 + 1;
    nPathOut = pVfs->mxPathname + 1;
    local_120 = iVar3;
    if (iVar3 < nPathOut) {
      local_120 = nPathOut;
    }
    zPathOut = (char *)sqlite3Malloc((long)local_120);
    *(u8 *)((long)&p_00->xRead + 1) = '\x01';
    if (zPathOut == (char *)0x0) {
      sqlite3_free(p_00);
      return 7;
    }
    if (bVar10) {
      memcpy(zPathOut,zFilename,(long)iVar3);
    }
    else {
      local_54 = sqlite3OsFullPathname(pVfs,zFilename,nPathOut,zPathOut);
      if (local_54 != 0) {
        if (local_54 != 0x200) {
          sqlite3_free(zPathOut);
          sqlite3_free(p_00);
          return local_54;
        }
        local_54 = 0;
      }
    }
    psStack_50 = sqlite3MutexAlloc(4);
    sqlite3_mutex_enter(psStack_50);
    psVar5 = sqlite3MutexAlloc(2);
    sqlite3_mutex_enter(psVar5);
    p = (Btree *)sqlite3SharedCacheList;
LAB_0013b82b:
    if (p != (Btree *)0x0) {
      __s2 = sqlite3PagerFilename((Pager *)p->db,0);
      iVar3 = strcmp(zPathOut,__s2);
      if ((iVar3 != 0) || (psVar6 = sqlite3PagerVfs((Pager *)p->db), psVar6 != pVfs))
      goto LAB_0013b943;
      pExisting._4_4_ = db->nDb;
      while (pExisting._4_4_ = pExisting._4_4_ + -1, -1 < pExisting._4_4_) {
        pBVar1 = db->aDb[pExisting._4_4_].pBt;
        if ((pBVar1 != (Btree *)0x0) && (pBVar1->pBt == (BtShared *)p)) {
          sqlite3_mutex_leave(psVar5);
          sqlite3_mutex_leave(psStack_50);
          sqlite3_free(zPathOut);
          sqlite3_free(p_00);
          return 0x13;
        }
      }
      p_00->xClose = (_func_int_sqlite3_file_ptr *)p;
      *(int *)&p[1].pNext = *(int *)&p[1].pNext + 1;
    }
    sqlite3_mutex_leave(psVar5);
    sqlite3_free(zPathOut);
  }
  if (p == (Btree *)0x0) {
    memset(zDbHeader + 8,0,8);
    p = (Btree *)sqlite3MallocZero(0x98);
    if ((BtShared *)p == (BtShared *)0x0) {
      local_54 = 7;
      goto LAB_0013bde3;
    }
    local_54 = sqlite3PagerOpen(pVfs,(Pager **)p,zFilename,0x88,pBt._4_4_,(uint)pBt,pageReinit);
    if (local_54 == 0) {
      sqlite3PagerSetMmapLimit(((BtShared *)p)->pPager,db->szMmap);
      local_54 = sqlite3PagerReadFileheader(((BtShared *)p)->pPager,100,(uchar *)&isMemdb);
    }
    if (local_54 != 0) goto LAB_0013bde3;
    ((BtShared *)p)->openFlags = (u8)pBt._4_4_;
    ((BtShared *)p)->db = db;
    sqlite3PagerSetBusyHandler(((BtShared *)p)->pPager,btreeInvokeBusyHandler,p);
    p_00->xClose = (_func_int_sqlite3_file_ptr *)p;
    ((BtShared *)p)->pCursor = (BtCursor *)0x0;
    ((BtShared *)p)->pPage1 = (MemPage *)0x0;
    uVar2 = sqlite3PagerIsreadonly(((BtShared *)p)->pPager);
    if (uVar2 != '\0') {
      ((BtShared *)p)->btsFlags = ((BtShared *)p)->btsFlags | 1;
    }
    ((BtShared *)p)->pageSize = (uint)zDbHeader[8] << 8 | (uint)zDbHeader[9] << 0x10;
    if (((((BtShared *)p)->pageSize < 0x200) || (0x10000 < ((BtShared *)p)->pageSize)) ||
       ((((BtShared *)p)->pageSize - 1 & ((BtShared *)p)->pageSize) != 0)) {
      ((BtShared *)p)->pageSize = 0;
      if ((zFilename != (char *)0x0) && (!bVar10)) {
        ((BtShared *)p)->autoVacuum = '\0';
        ((BtShared *)p)->incrVacuum = '\0';
      }
      local_55 = 0;
    }
    else {
      local_55 = zDbHeader[0xc];
      ((BtShared *)p)->btsFlags = ((BtShared *)p)->btsFlags | 2;
      uVar4 = sqlite3Get4byte(zDbHeader + 0x2c);
      ((BtShared *)p)->autoVacuum = uVar4 != 0;
      uVar4 = sqlite3Get4byte(zDbHeader + 0x38);
      ((BtShared *)p)->incrVacuum = uVar4 != 0;
    }
    local_54 = sqlite3PagerSetPagesize
                         (((BtShared *)p)->pPager,&((BtShared *)p)->pageSize,(uint)local_55);
    if (local_54 != 0) goto LAB_0013bde3;
    ((BtShared *)p)->usableSize = ((BtShared *)p)->pageSize - (uint)local_55;
    ((BtShared *)p)->nRef = 1;
    if (*(u8 *)((long)&p_00->xRead + 1) != '\0') {
      psVar5 = sqlite3MutexAlloc(2);
      if (sqlite3Config.bCoreMutex != '\0') {
        psVar7 = sqlite3MutexAlloc(0);
        ((BtShared *)p)->mutex = psVar7;
        if (((BtShared *)p)->mutex == (sqlite3_mutex *)0x0) {
          local_54 = 7;
          goto LAB_0013bde3;
        }
      }
      sqlite3_mutex_enter(psVar5);
      ((BtShared *)p)->pNext = sqlite3SharedCacheList;
      sqlite3SharedCacheList = (BtShared *)p;
      sqlite3_mutex_leave(psVar5);
    }
  }
  if (*(u8 *)((long)&p_00->xRead + 1) != '\0') {
    for (pSib._4_4_ = 0; pSib._4_4_ < db->nDb; pSib._4_4_ = pSib._4_4_ + 1) {
      pFile = (sqlite3_file *)db->aDb[pSib._4_4_].pBt;
      if (((Btree *)pFile != (Btree *)0x0) && (((Btree *)pFile)->sharable != '\0'))
      goto LAB_0013bcae;
    }
  }
  goto LAB_0013bdd8;
LAB_0013b943:
  p = p[1].pPrev;
  goto LAB_0013b82b;
LAB_0013bcae:
  for (; pFile[5].pMethods != (sqlite3_io_methods *)0x0; pFile = (sqlite3_file *)pFile[5].pMethods)
  {
  }
  if ((BtShared *)p_00->xClose < (BtShared *)pFile[1].pMethods) {
    p_00->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)pFile;
    p_00->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
    pFile[5].pMethods = p_00;
  }
  else {
    while( true ) {
      bVar9 = false;
      if (pFile[4].pMethods != (sqlite3_io_methods *)0x0) {
        bVar9 = (BtShared *)(pFile[4].pMethods)->xClose < (BtShared *)p_00->xClose;
      }
      if (!bVar9) break;
      pFile = (sqlite3_file *)pFile[4].pMethods;
    }
    p_00->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)pFile[4].pMethods;
    p_00->xSync = (_func_int_sqlite3_file_ptr_int *)pFile;
    if ((Btree *)p_00->xTruncate != (Btree *)0x0) {
      ((Btree *)p_00->xTruncate)->pPrev = (Btree *)p_00;
    }
    pFile[4].pMethods = p_00;
  }
LAB_0013bdd8:
  *ppBtree = (Btree *)p_00;
LAB_0013bde3:
  if (local_54 == 0) {
    pvVar8 = sqlite3BtreeSchema((Btree *)p_00,0,(_func_void_void_ptr *)0x0);
    if (pvVar8 == (void *)0x0) {
      sqlite3BtreeSetCacheSize((Btree *)p_00,-2000);
    }
    id = sqlite3PagerFile((Pager *)p->db);
    if (id->pMethods != (sqlite3_io_methods *)0x0) {
      sqlite3OsFileControlHint(id,0x1e,&p->pBt);
    }
  }
  else {
    if ((p != (Btree *)0x0) && (p->db != (sqlite3 *)0x0)) {
      sqlite3PagerClose((Pager *)p->db,(sqlite3 *)0x0);
    }
    sqlite3_free(p);
    sqlite3_free(p_00);
    *ppBtree = (Btree *)0x0;
  }
  if (psStack_50 != (sqlite3_mutex *)0x0) {
    sqlite3_mutex_leave(psStack_50);
  }
  return local_54;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          if( rc==SQLITE_OK_SYMLINK ){
            rc = SQLITE_OK;
          }else{
            sqlite3_free(zFullPathname);
            sqlite3_free(p);
            return rc;
          }
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );

    /* Suppress false-positive compiler warning from PVS-Studio */
    memset(&zDbHeader[16], 0, 8);

    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyHandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;

    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#if defined(SQLITE_SECURE_DELETE)
    pBt->btsFlags |= BTS_SECURE_DELETE;
#elif defined(SQLITE_FAST_SECURE_DELETE)
    pBt->btsFlags |= BTS_OVERWRITE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3BtreeSetCacheSize(p, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}